

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O1

void __thiscall
QTriangulatingStroker::arcPoints
          (QTriangulatingStroker *this,float cx,float cy,float fromX,float fromY,float toX,float toY
          ,QVarLengthArray<float,_256LL> *points)

{
  double dVar1;
  long aalloc;
  long lVar2;
  long in_FS_OFFSET;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  fVar4 = fromY - cy;
  fVar5 = fromX - cx;
  fVar6 = toX - cx;
  fVar7 = toY - cy;
  fVar3 = -fVar6;
  if (fVar5 * fVar7 - fVar4 * fVar6 < 0.0) {
    do {
      dVar1 = (double)fVar4;
      fVar4 = (float)((double)fVar5 * *(double *)(this + 0x40) + *(double *)(this + 0x48) * dVar1);
      fVar5 = (float)((double)fVar5 * *(double *)(this + 0x48) + -*(double *)(this + 0x40) * dVar1);
      local_2c = fVar5 + cx;
      QVLABase<float>::emplace_back_impl<float>
                (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
                 &local_2c);
      local_2c = fVar4 + cy;
      QVLABase<float>::emplace_back_impl<float>
                (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
                 &local_2c);
    } while (fVar5 * fVar7 + fVar4 * fVar3 < 0.0);
  }
  if (fVar5 * fVar6 + fVar7 * fVar4 < 0.0) {
    do {
      dVar1 = (double)fVar4;
      fVar4 = (float)((double)fVar5 * *(double *)(this + 0x40) + *(double *)(this + 0x48) * dVar1);
      fVar5 = (float)((double)fVar5 * *(double *)(this + 0x48) + -*(double *)(this + 0x40) * dVar1);
      local_2c = fVar5 + cx;
      QVLABase<float>::emplace_back_impl<float>
                (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
                 &local_2c);
      local_2c = fVar4 + cy;
      QVLABase<float>::emplace_back_impl<float>
                (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
                 &local_2c);
    } while (fVar5 * fVar6 + fVar7 * fVar4 < 0.0);
  }
  if (0.0 < fVar5 * fVar7 + fVar4 * fVar3) {
    do {
      dVar1 = (double)fVar4;
      fVar4 = (float)((double)fVar5 * *(double *)(this + 0x40) + *(double *)(this + 0x48) * dVar1);
      fVar5 = (float)((double)fVar5 * *(double *)(this + 0x48) + -*(double *)(this + 0x40) * dVar1);
      local_2c = fVar5 + cx;
      QVLABase<float>::emplace_back_impl<float>
                (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
                 &local_2c);
      local_2c = fVar4 + cy;
      QVLABase<float>::emplace_back_impl<float>
                (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
                 &local_2c);
    } while (0.0 < fVar5 * fVar7 + fVar4 * fVar3);
  }
  lVar2 = (points->super_QVLABase<float>).super_QVLABaseBase.s;
  if (lVar2 != 0) {
    lVar2 = lVar2 + -2;
    aalloc = (points->super_QVLABase<float>).super_QVLABaseBase.a;
    if (aalloc <= lVar2) {
      aalloc = lVar2;
    }
    QVLABase<float>::reallocate_impl
              (&points->super_QVLABase<float>,0x100,&points->super_QVLAStorage<4UL,_4UL,_256LL>,
               lVar2,aalloc);
    (points->super_QVLABase<float>).super_QVLABaseBase.s = lVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::arcPoints(float cx, float cy, float fromX, float fromY, float toX, float toY, QVarLengthArray<float> &points)
{
    float dx1 = fromX - cx;
    float dy1 = fromY - cy;
    float dx2 = toX - cx;
    float dy2 = toY - cy;

    // while more than 180 degrees left:
    while (dx1 * dy2 - dx2 * dy1 < 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // while more than 90 degrees left:
    while (dx1 * dx2 + dy1 * dy2 < 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // while more than 0 degrees left:
    while (dx1 * dy2 - dx2 * dy1 > 0) {
        float tmpx = dx1 * m_cos_theta - dy1 * m_sin_theta;
        float tmpy = dx1 * m_sin_theta + dy1 * m_cos_theta;
        dx1 = tmpx;
        dy1 = tmpy;
        points.append(cx + dx1);
        points.append(cy + dy1);
    }

    // remove last point which was rotated beyond [toX, toY].
    if (!points.isEmpty())
        points.resize(points.size() - 2);
}